

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

Reference<std::allocator<absl::cord_internal::CordRep_*>_> __thiscall
absl::inlined_vector_internal::
Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>::
EmplaceBackSlow<absl::cord_internal::CordRep*const&>
          (Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>
           *this,CordRep **args)

{
  allocator<absl::cord_internal::CordRep_*> *paVar1;
  SizeType<std::allocator<absl::cord_internal::CordRep_*>_> requested_capacity_00;
  Pointer<std::allocator<absl::cord_internal::CordRep_*>_> ppCVar2;
  Pointer<std::allocator<absl::cord_internal::CordRep_*>_> *pppCVar3;
  Allocation<std::allocator<absl::cord_internal::CordRep_*>_> allocation;
  Pointer<std::allocator<absl::cord_internal::CordRep_*>_> last_ptr;
  Pointer<std::allocator<absl::cord_internal::CordRep_*>_> construct_data;
  SizeType<std::allocator<absl::cord_internal::CordRep_*>_> requested_capacity;
  IteratorValueAdapter<std::allocator<absl::cord_internal::CordRep_*>,_std::move_iterator<absl::cord_internal::CordRep_**>_>
  local_48;
  IteratorValueAdapter<std::allocator<absl::cord_internal::CordRep_*>,_std::move_iterator<absl::cord_internal::CordRep_**>_>
  move_values;
  AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_> allocation_tx;
  StorageView<std::allocator<absl::cord_internal::CordRep_*>_> storage_view;
  CordRep **args_local;
  Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
  *this_local;
  
  Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>::
  MakeStorageView((StorageView<std::allocator<absl::cord_internal::CordRep_*>_> *)
                  &allocation_tx.capacity_,
                  (Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
                   *)this);
  paVar1 = Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
           ::GetAllocator((Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
                           *)this);
  AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_>::AllocationTransaction
            ((AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_> *)&move_values,
             paVar1);
  std::move_iterator<absl::cord_internal::CordRep_**>::move_iterator
            ((move_iterator<absl::cord_internal::CordRep_**> *)&requested_capacity,
             (iterator_type)allocation_tx.capacity_);
  IteratorValueAdapter<std::allocator<absl::cord_internal::CordRep_*>,_std::move_iterator<absl::cord_internal::CordRep_**>_>
  ::IteratorValueAdapter
            (&local_48,(move_iterator<absl::cord_internal::CordRep_**> *)&requested_capacity);
  requested_capacity_00 =
       Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
       ::NextCapacity(storage_view.size);
  ppCVar2 = AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_>::Allocate
                      ((AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_> *)
                       &move_values,requested_capacity_00);
  paVar1 = Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
           ::GetAllocator((Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
                           *)this);
  std::allocator_traits<std::allocator<absl::cord_internal::CordRep*>>::
  construct<absl::cord_internal::CordRep*,absl::cord_internal::CordRep*const&>
            (paVar1,ppCVar2 + (long)storage_view.data,args);
  paVar1 = Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
           ::GetAllocator((Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
                           *)this);
  pppCVar3 = AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_>::GetData
                       ((AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_> *)
                        &move_values);
  ConstructElements<std::allocator<absl::cord_internal::CordRep*>,absl::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::cord_internal::CordRep*>,std::move_iterator<absl::cord_internal::CordRep**>>>
            (paVar1,*pppCVar3,&local_48,
             (SizeType<std::allocator<absl::cord_internal::CordRep_*>_>)storage_view.data);
  paVar1 = Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
           ::GetAllocator((Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
                           *)this);
  DestroyAdapter<std::allocator<absl::cord_internal::CordRep_*>,_true>::DestroyElements
            (paVar1,(Pointer<std::allocator<absl::cord_internal::CordRep_*>_>)
                    allocation_tx.capacity_,
             (SizeType<std::allocator<absl::cord_internal::CordRep_*>_>)storage_view.data);
  Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>::
  DeallocateIfAllocated
            ((Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
              *)this);
  allocation = AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_>::Release
                         ((AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_> *)
                          &move_values);
  Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>::
  SetAllocation((Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
                 *)this,allocation);
  Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>::
  SetIsAllocated((Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
                  *)this);
  Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>::
  AddSize((Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
           *)this,1);
  AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_>::~AllocationTransaction
            ((AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_> *)&move_values)
  ;
  return ppCVar2 + (long)storage_view.data;
}

Assistant:

auto Storage<T, N, A>::EmplaceBackSlow(Args&&... args) -> Reference<A> {
  StorageView<A> storage_view = MakeStorageView();
  AllocationTransaction<A> allocation_tx(GetAllocator());
  IteratorValueAdapter<A, MoveIterator<A>> move_values(
      MoveIterator<A>(storage_view.data));
  SizeType<A> requested_capacity = NextCapacity(storage_view.capacity);
  Pointer<A> construct_data = allocation_tx.Allocate(requested_capacity);
  Pointer<A> last_ptr = construct_data + storage_view.size;

  // Construct new element.
  AllocatorTraits<A>::construct(GetAllocator(), last_ptr,
                                std::forward<Args>(args)...);
  // Move elements from old backing store to new backing store.
  ABSL_INTERNAL_TRY {
    ConstructElements<A>(GetAllocator(), allocation_tx.GetData(), move_values,
                         storage_view.size);
  }